

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neighbor-graph.c
# Opt level: O1

void mpr_clear_addr_set(avl_tree *set)

{
  avl_node *paVar1;
  avl_node *node;
  
  node = (avl_node *)(set->list_head).next;
  if ((node->list).prev != (set->list_head).prev) {
    do {
      paVar1 = (avl_node *)(node->list).next;
      avl_remove(set,node);
      free(&node[-1].right);
      node = paVar1;
    } while ((paVar1->list).prev != (set->list_head).prev);
  }
  return;
}

Assistant:

void
mpr_clear_addr_set(struct avl_tree *set) {
  struct addr_node *current_node, *node_it;

  avl_for_each_element_safe(set, current_node, _avl_node, node_it) {
    avl_remove(set, &current_node->_avl_node);
    free(current_node);
  }
}